

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O2

void __thiscall BRTS<UF>::PerformLabeling(BRTS<UF> *this)

{
  Data_Compressed *this_00;
  undefined8 uVar1;
  ushort uVar2;
  uint uVar3;
  int _width;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Run *pRVar12;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar3 = *(uint *)&pMVar4->field_0x8;
  _width = *(int *)&pMVar4->field_0xc;
  this_00 = &this->data_compressed;
  Data_Compressed::Alloc(this_00,uVar3,_width);
  InitCompressedData(this,this_00);
  Runs::Alloc(&this->data_runs,uVar3,_width);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *UF::P_ = 0;
  UF::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,uVar3,(this->data_compressed).data_width,
           (this->data_runs).runs);
  pRVar12 = (this->data_runs).runs;
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar1;
  local_98.width = (int)((ulong)uVar1 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar9 = 0;
  uVar11 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar11 = uVar9;
  }
  for (; puVar8 = UF::P_, uVar9 != uVar11; uVar9 = uVar9 + 1) {
    lVar6 = **(long **)&pMVar5->field_0x48;
    lVar7 = *(long *)&pMVar5->field_0x10;
    for (; uVar10 = (ulong)pRVar12->start_pos, uVar10 != 0xffff; pRVar12 = pRVar12 + 1) {
      uVar2 = pRVar12->end_pos;
      uVar3 = puVar8[pRVar12->label];
      for (; uVar10 < uVar2; uVar10 = uVar10 + 1) {
        *(uint *)(lVar6 * uVar9 + lVar7 + uVar10 * 4) = uVar3;
      }
    }
    pRVar12 = pRVar12 + 1;
  }
  UF::Dealloc();
  Runs::Dealloc(&this->data_runs);
  Data_Compressed::Dealloc(this_00);
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size(), 0); // (0-init)
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }